

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
StringInstance::op_atIndex
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  undefined8 *puVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  IntegerInstance local_80;
  
  value = (arguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)value == 0x20) {
    IntegerInstance::IntegerInstance(&local_80,value);
    CharacterInstance::~CharacterInstance((CharacterInstance *)&local_80);
    if ((-1 < local_80._value) && (local_80._value < (int)(this->_value)._M_string_length)) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_a0,'\x01');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                     "\'",&local_a0);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                     "\'");
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      return __return_storage_ptr__;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar2 = "RuntimeError: invalid argument.";
  }
  else {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar2 = "RuntimeError: wrong number of arguments.";
  }
  *puVar1 = pcVar2;
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_atIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int index = IntegerInstance(arguments[0]).value();
    if (index < 0 || index >= int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    return "'" + std::string(1, _value[index]) + "'";
}